

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O2

void __thiscall Js::NumberSet::NumberSet(NumberSet *this)

{
  (this->set).
  super_BaseDictionary<unsigned_int,_unsigned_int,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .buckets = (Type)0x0;
  (this->set).
  super_BaseDictionary<unsigned_int,_unsigned_int,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .entries = (Type)0x0;
  (this->set).
  super_BaseDictionary<unsigned_int,_unsigned_int,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .alloc = (Type)&Memory::NoCheckHeapAllocator::Instance;
  (this->set).
  super_BaseDictionary<unsigned_int,_unsigned_int,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .size = 0;
  (this->set).
  super_BaseDictionary<unsigned_int,_unsigned_int,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .bucketCount = 0;
  (this->set).
  super_BaseDictionary<unsigned_int,_unsigned_int,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .count = 0;
  (this->set).
  super_BaseDictionary<unsigned_int,_unsigned_int,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .freeCount = 0;
  (this->set).
  super_BaseDictionary<unsigned_int,_unsigned_int,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .modFunctionIndex = 0x4b;
  (this->set).
  super_BaseDictionary<unsigned_int,_unsigned_int,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .stats = (Type)0x0;
  return;
}

Assistant:

NumberSet::NumberSet() : set(&NoCheckHeapAllocator::Instance) {}